

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

void xercesc_4_0::XMLString::upperCaseASCII(XMLCh *toUpperCase)

{
  XMLCh *local_18;
  XMLCh *psz1;
  XMLCh *toUpperCase_local;
  
  local_18 = toUpperCase;
  if (toUpperCase != (XMLCh *)0x0) {
    for (; *local_18 != L'\0'; local_18 = local_18 + 1) {
      if ((0x60 < (ushort)*local_18) && ((ushort)*local_18 < 0x7b)) {
        *local_18 = *local_18 + L'￠';
      }
    }
  }
  return;
}

Assistant:

void XMLString::upperCaseASCII(XMLCh* const toUpperCase)
{
    XMLCh* psz1 = toUpperCase;

    if (!psz1)
        return;

    while (*psz1) {
        if (*psz1 >= chLatin_a && *psz1 <= chLatin_z)
            *psz1 = *psz1 - chLatin_a + chLatin_A;

        psz1++;
    }
}